

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_0::CopyImageTest::init(CopyImageTest *this,EVP_PKEY_CTX *ctx)

{
  TestLog *log;
  RenderContext *context;
  bool bVar1;
  ContextType CVar2;
  GLSLVersion glslVersion;
  int iVar3;
  ContextInfo *pCVar4;
  SeedBuilder *builder_00;
  State *rnd;
  NotSupportedError *this_00;
  SeedBuilder builder;
  SeedBuilder local_5c;
  ContextInfo *local_58;
  string local_50;
  
  pCVar4 = glu::ContextInfo::create(((this->super_TestCase).m_context)->m_renderCtx);
  local_58 = pCVar4;
  CVar2.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(CVar2,(ApiType)0x23);
  if (!bVar1) {
    bVar1 = glu::ContextInfo::isExtensionSupported(pCVar4,"GL_EXT_copy_image");
    if (!bVar1) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"Extension GL_EXT_copy_image not supported.",
                 SSBOArrayLengthTests::init::arraysSized + 1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                 ,0x784);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  checkFormatSupport(pCVar4,(this->m_srcImageInfo).m_format,(this->m_srcImageInfo).m_target,
                     ((this->super_TestCase).m_context)->m_renderCtx);
  checkFormatSupport(pCVar4,(this->m_dstImageInfo).m_format,(this->m_dstImageInfo).m_target,
                     ((this->super_TestCase).m_context)->m_renderCtx);
  tcu::SeedBuilder::SeedBuilder(&local_5c);
  builder_00 = tcu::operator<<(&local_5c,0xdcb2c);
  anon_unknown_0::operator<<(builder_00,&this->m_srcImageInfo);
  anon_unknown_0::operator<<(builder_00,&this->m_dstImageInfo);
  rnd = (State *)operator_new(0xf8);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  deRandom_init((deRandom *)rnd,local_5c.m_hash);
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  tcu::ResultCollector::ResultCollector(&rnd->results,log,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  pCVar4 = local_58;
  rnd->srcImage = (ObjectWrapper *)0x0;
  rnd->dstImage = (ObjectWrapper *)0x0;
  CVar2.super_ApiType.m_bits = (ApiType)(*context->_vptr_RenderContext[2])(context);
  glslVersion = glu::getContextTypeGLSLVersion(CVar2);
  gls::TextureTestUtil::TextureRenderer::TextureRenderer
            (&rnd->textureRenderer,context,log,glslVersion,PRECISION_HIGHP);
  (rnd->dstImageLevels).
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (rnd->dstImageLevels).
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (rnd->srcImageLevels).
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (rnd->dstImageLevels).
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (rnd->srcImageLevels).
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (rnd->srcImageLevels).
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->m_state = rnd;
  iVar3 = (*pCVar4->_vptr_ContextInfo[1])(pCVar4);
  return iVar3;
}

Assistant:

void CopyImageTest::init (void)
{
	de::UniquePtr<glu::ContextInfo> ctxInfo(glu::ContextInfo::create(m_context.getRenderContext()));
	const bool						isES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!isES32 && !ctxInfo->isExtensionSupported("GL_EXT_copy_image"))
		throw tcu::NotSupportedError("Extension GL_EXT_copy_image not supported.", "", __FILE__, __LINE__);

	checkFormatSupport(*ctxInfo, m_srcImageInfo.getFormat(), m_srcImageInfo.getTarget(), m_context.getRenderContext());
	checkFormatSupport(*ctxInfo, m_dstImageInfo.getFormat(), m_dstImageInfo.getTarget(), m_context.getRenderContext());

	{
		SeedBuilder builder;

		builder << 903980
				<< m_srcImageInfo
				<< m_dstImageInfo;

		m_state = new State(builder.get(), m_testCtx.getLog(), m_context.getRenderContext());
	}
}